

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPasvDataTransfer.cpp
# Opt level: O2

void __thiscall CPasvDataTransfer::Execute(CPasvDataTransfer *this)

{
  int __fd;
  int client_fd;
  socklen_t len;
  sockaddr_in clientaddr;
  socklen_t local_24;
  sockaddr local_20;
  sockaddr *__addr;
  
  local_24 = 0x10;
  __addr = &local_20;
  __fd = accept(this->m_Sock,__addr,&local_24);
  client_fd = (int)__addr;
  this->m_CliSock = __fd;
  sem_wait((sem_t *)&this->m_Signal);
  DispatchCommand(this,client_fd);
  close(__fd);
  ~CPasvDataTransfer(this);
  operator_delete(this);
  return;
}

Assistant:

void CPasvDataTransfer::Execute() {
    int clientsock;
    struct sockaddr_in clientaddr;

    socklen_t len = sizeof(clientaddr);

    clientsock = accept(m_Sock, (struct sockaddr *)&clientaddr, &len);
    m_CliSock = clientsock;
    sem_wait(&m_Signal);
    int ret = DispatchCommand(clientsock);

    close(clientsock);
    delete this;
}